

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

size_t my_strcat(char *buf,char *src,size_t bufsize)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  ulong uVar3;
  
  sVar1 = strlen(buf);
  if (sVar1 + 1 < bufsize) {
    sVar2 = strlen(src);
    uVar3 = bufsize - sVar1;
    if (uVar3 != 0) {
      __n = uVar3 - 1;
      if (sVar2 < uVar3) {
        __n = sVar2;
      }
      memcpy(buf + sVar1,src,__n);
      (buf + sVar1)[__n] = '\0';
    }
  }
  else {
    sVar2 = strlen(src);
  }
  return sVar2 + sVar1;
}

Assistant:

size_t my_strcat(char *buf, const char *src, size_t bufsize)
{
	size_t dlen = strlen(buf);

	/* Is there room left in the buffer? */
	if (dlen + 1 < bufsize) {
		/* Append as much as possible  */
		return (dlen + my_strcpy(buf + dlen, src, bufsize - dlen));
	} else {
		/* Return without appending */
		return (dlen + strlen(src));
	}
}